

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_fun(Parser *parser,Modifier *modifier)

{
  Token *name_00;
  List *args_00;
  void *pvVar1;
  FunStmt *pFVar2;
  void *block;
  List *args;
  Token *name;
  Modifier *modifier_local;
  Parser *parser_local;
  
  name_00 = parser->token;
  move(parser);
  expect(parser,OP_BRA);
  args_00 = new_list();
  while (parser->token->kind != CL_BRA) {
    pvVar1 = parse_stmt(parser);
    list_add(args_00,pvVar1);
    if (parser->token->kind != CL_BRA) {
      expect(parser,COMM);
    }
  }
  expect(parser,CL_BRA);
  pvVar1 = parse_block(parser);
  pFVar2 = new_fun_stmt(name_00,args_00,pvVar1,modifier);
  return pFVar2;
}

Assistant:

void *parse_fun(Parser *parser, Modifier *modifier) {
    Token *name = token(parser);
    move(parser);
    expect(parser, OP_BRA);
    List *args = new_list();
    while (token(parser)->kind != CL_BRA) {
        list_add(args, parse_stmt(parser));
        if (token(parser)->kind != CL_BRA) {
            expect(parser, COMM);
        }
    }
    expect(parser, CL_BRA);
    void *block = parse_block(parser);
    return new_fun_stmt(name, args, block, modifier);
}